

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gen.hpp
# Opt level: O0

void __thiscall
rc::Gen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
GenImpl<rc::gen::detail::FilterGen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/test_Bech32.cpp:25:73)>_>
::retain(GenImpl<rc::gen::detail::FilterGen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_dcdpr[P]libbech32_test_testbech32_test_Bech32_cpp:25:73)>_>
         *this)

{
  GenImpl<rc::gen::detail::FilterGen<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_dcdpr[P]libbech32_test_testbech32_test_Bech32_cpp:25:73)>_>
  *this_local;
  
  LOCK();
  (this->m_count).super___atomic_base<long>._M_i =
       (this->m_count).super___atomic_base<long>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void retain() override { m_count.fetch_add(1L); }